

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  allocator local_189;
  string local_188 [8];
  string outFile;
  allocator local_161;
  string local_160 [8];
  string inFile;
  allocator local_139;
  string local_138 [8];
  string modelFile_2;
  allocator local_111;
  string local_110 [8];
  string modelFile_1;
  allocator local_e9;
  string local_e8 [8];
  string modelFile;
  allocator local_c1;
  string local_c0 [8];
  string resultModelFile;
  allocator local_99;
  string local_98 [8];
  string datasetFile;
  allocator local_71;
  string local_70 [8];
  string alphabetFile;
  allocator local_39;
  string local_38 [8];
  string mode;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    PrintUsage(argv);
    argv_local._4_4_ = 0x2a;
  }
  else {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"train");
    if (bVar2) {
      if (argc < 5) {
        PrintUsage(argv);
        argv_local._4_4_ = 0x2a;
      }
      else {
        pcVar1 = argv[2];
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_70,pcVar1,&local_71);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
        pcVar1 = argv[3];
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_98,pcVar1,&local_99);
        std::allocator<char>::~allocator((allocator<char> *)&local_99);
        pcVar1 = argv[4];
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c0,pcVar1,&local_c1);
        std::allocator<char>::~allocator((allocator<char> *)&local_c1);
        argv_local._4_4_ = Train((string *)local_70,(string *)local_98,(string *)local_c0);
        std::__cxx11::string::~string(local_c0);
        std::__cxx11::string::~string(local_98);
        std::__cxx11::string::~string(local_70);
      }
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"score");
      if (bVar2) {
        if (argc < 3) {
          PrintUsage(argv);
          argv_local._4_4_ = 0x2a;
        }
        else {
          pcVar1 = argv[2];
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_e8,pcVar1,&local_e9);
          std::allocator<char>::~allocator((allocator<char> *)&local_e9);
          argv_local._4_4_ = Score((string *)local_e8);
          std::__cxx11::string::~string(local_e8);
        }
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"correct");
        if (bVar2) {
          if (argc < 3) {
            PrintUsage(argv);
            argv_local._4_4_ = 0x2a;
          }
          else {
            pcVar1 = argv[2];
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_110,pcVar1,&local_111);
            std::allocator<char>::~allocator((allocator<char> *)&local_111);
            argv_local._4_4_ = Correct((string *)local_110);
            std::__cxx11::string::~string(local_110);
          }
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_38,"fix");
          if (bVar2) {
            if (argc < 5) {
              PrintUsage(argv);
              argv_local._4_4_ = 0x2a;
            }
            else {
              pcVar1 = argv[2];
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_138,pcVar1,&local_139);
              std::allocator<char>::~allocator((allocator<char> *)&local_139);
              pcVar1 = argv[3];
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_160,pcVar1,&local_161);
              std::allocator<char>::~allocator((allocator<char> *)&local_161);
              pcVar1 = argv[4];
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_188,pcVar1,&local_189);
              std::allocator<char>::~allocator((allocator<char> *)&local_189);
              argv_local._4_4_ = Fix((string *)local_138,(string *)local_160,(string *)local_188);
              std::__cxx11::string::~string(local_188);
              std::__cxx11::string::~string(local_160);
              std::__cxx11::string::~string(local_138);
            }
          }
          else {
            PrintUsage(argv);
            argv_local._4_4_ = 0x2a;
          }
        }
      }
    }
    std::__cxx11::string::~string(local_38);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char** argv) {
    if (argc < 2) {
        PrintUsage(argv);
        return 42;
    }
    std::string mode = argv[1];
    if (mode == "train") {
        if (argc < 5) {
            PrintUsage(argv);
            return 42;
        }
        std::string alphabetFile = argv[2];
        std::string datasetFile = argv[3];
        std::string resultModelFile = argv[4];
        return Train(alphabetFile, datasetFile, resultModelFile);
    } else if (mode == "score") {
        if (argc < 3) {
            PrintUsage(argv);
            return 42;
        }
        std::string modelFile = argv[2];
        return Score(modelFile);
    } else if (mode == "correct") {
        if (argc < 3) {
            PrintUsage(argv);
            return 42;
        }
        std::string modelFile = argv[2];
        return Correct(modelFile);
    } else if (mode == "fix") {
        if (argc < 5) {
            PrintUsage(argv);
            return 42;
        }
        std::string modelFile = argv[2];
        std::string inFile = argv[3];
        std::string outFile = argv[4];
        return Fix(modelFile, inFile, outFile);
    }

    PrintUsage(argv);
    return 42;
}